

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O2

void test_modinv32_uint16(uint16_t *out,uint16_t *in,uint16_t *mod)

{
  uint16_t *puVar1;
  uint16_t *puVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint64_t uVar7;
  long lVar8;
  ulong uVar9;
  undefined8 uVar10;
  char *pcVar11;
  code *pcVar12;
  bool bVar13;
  secp256k1_modinv32_modinfo m;
  uint16_t tmp [16];
  secp256k1_modinv32_signed30 x;
  uint16_t negone [16];
  
  uint16_to_signed30(&x,in);
  uint16_to_signed30(&m.modulus,mod);
  uVar7 = modinv2p64((long)m.modulus.v[0]);
  m.modulus_inv30 = (uint)uVar7 & 0x3fffffff;
  if ((m.modulus.v[0] * (uint)uVar7 & 0x3fffffff) != 1) {
    pcVar11 = "test condition failed: ((m.modulus_inv30 * m.modulus.v[0]) & 0x3fffffff) == 1";
    uVar10 = 0x370;
    goto LAB_0012edf4;
  }
  if ((((x.v[7] != 0 || x.v[3] != 0) || (x.v[5] != 0 || x.v[1] != 0)) ||
      ((x.v[6] != 0 || x.v[2] != 0) || (x.v[4] != 0 || x.v[0] != 0))) || x.v[8] != 0) {
    mulmod256(tmp,in,in,mod);
    uint16_to_signed30(&x,tmp);
    uVar5 = secp256k1_jacobi32_maybe_var(&x,&m);
    if (1 < uVar5) {
      pcVar11 = "test condition failed: jac == 0 || jac == 1";
      uVar10 = 0x37a;
      goto LAB_0012edf4;
    }
    negone[0] = *mod - 1;
    for (lVar8 = 1; lVar8 != 0x10; lVar8 = lVar8 + 1) {
      negone[lVar8] = mod[lVar8];
    }
    mulmod256(tmp,tmp,negone,mod);
    uint16_to_signed30(&x,tmp);
    iVar6 = secp256k1_jacobi32_maybe_var(&x,&m);
    if ((iVar6 != 0) && (iVar6 != 1 - (*mod & 2))) {
      pcVar11 = "test condition failed: jac == 0 || jac == 1 - (mod[0] & 2)";
      uVar10 = 0x382;
      goto LAB_0012edf4;
    }
  }
  uint16_to_signed30(&x,in);
  iVar6 = 0x10;
  while (bVar13 = iVar6 != 0, iVar6 = iVar6 + -1, bVar13) {
    uVar7 = testrand64();
    uVar9 = uVar7 >> 0x3d;
    iVar3 = m.modulus.v[uVar9];
    if (iVar3 < 1) {
      if ((iVar3 < 0) && (iVar4 = m.modulus.v[uVar9 + 1], 0x3ffffffe < iVar4)) {
        m.modulus.v[uVar9] = iVar3 + 0x40000000;
        m.modulus.v[uVar9 + 1] = iVar4 + -1;
      }
    }
    else {
      iVar4 = m.modulus.v[uVar9 + 1];
      if (iVar4 < 0x40000000) {
        m.modulus.v[uVar9] = iVar3 + -0x40000000;
        m.modulus.v[uVar9 + 1] = iVar4 + 1;
      }
    }
  }
  iVar6 = 0;
  while( true ) {
    if (iVar6 == 2) {
      return;
    }
    pcVar12 = secp256k1_modinv32_var;
    if (iVar6 == 0) {
      pcVar12 = secp256k1_modinv32;
    }
    (*pcVar12)(&x,&m);
    signed30_to_uint16(out,&x);
    mulmod256(tmp,out,in,mod);
    if (tmp[0] != ((((x.v[7] != 0 || x.v[3] != 0) || (x.v[5] != 0 || x.v[1] != 0)) ||
                   ((x.v[6] != 0 || x.v[2] != 0) || (x.v[4] != 0 || x.v[0] != 0))) || x.v[8] != 0))
    break;
    lVar8 = 1;
    while (lVar8 != 0x10) {
      puVar1 = tmp + lVar8;
      lVar8 = lVar8 + 1;
      if (*puVar1 != 0) {
        pcVar11 = "test condition failed: tmp[i] == 0";
        uVar10 = 0x391;
        goto LAB_0012edf4;
      }
    }
    (*pcVar12)(&x,&m);
    signed30_to_uint16(tmp,&x);
    lVar8 = 0;
    while (lVar8 != 0x10) {
      puVar2 = tmp + lVar8;
      puVar1 = in + lVar8;
      lVar8 = lVar8 + 1;
      if (*puVar2 != *puVar1) {
        pcVar11 = "test condition failed: tmp[i] == in[i]";
        uVar10 = 0x398;
        goto LAB_0012edf4;
      }
    }
    iVar6 = iVar6 + 1;
  }
  pcVar11 = "test condition failed: tmp[0] == nonzero";
  uVar10 = 0x390;
LAB_0012edf4:
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
          ,uVar10,pcVar11);
  abort();
}

Assistant:

static void test_modinv32_uint16(uint16_t* out, const uint16_t* in, const uint16_t* mod) {
    uint16_t tmp[16];
    secp256k1_modinv32_signed30 x;
    secp256k1_modinv32_modinfo m;
    int i, vartime, nonzero;

    uint16_to_signed30(&x, in);
    nonzero = (x.v[0] | x.v[1] | x.v[2] | x.v[3] | x.v[4] | x.v[5] | x.v[6] | x.v[7] | x.v[8]) != 0;
    uint16_to_signed30(&m.modulus, mod);

    /* compute 1/modulus mod 2^30 */
    m.modulus_inv30 = modinv2p64(m.modulus.v[0]) & 0x3fffffff;
    CHECK(((m.modulus_inv30 * m.modulus.v[0]) & 0x3fffffff) == 1);

    /* Test secp256k1_jacobi32_maybe_var. */
    if (nonzero) {
        int jac;
        uint16_t sqr[16], negone[16];
        mulmod256(sqr, in, in, mod);
        uint16_to_signed30(&x, sqr);
        /* Compute jacobi symbol of in^2, which must be 1 (or uncomputable). */
        jac = secp256k1_jacobi32_maybe_var(&x, &m);
        CHECK(jac == 0 || jac == 1);
        /* Then compute the jacobi symbol of -(in^2). x and -x have opposite
         * jacobi symbols if and only if (mod % 4) == 3. */
        negone[0] = mod[0] - 1;
        for (i = 1; i < 16; ++i) negone[i] = mod[i];
        mulmod256(sqr, sqr, negone, mod);
        uint16_to_signed30(&x, sqr);
        jac = secp256k1_jacobi32_maybe_var(&x, &m);
        CHECK(jac == 0 || jac == 1 - (mod[0] & 2));
    }

    uint16_to_signed30(&x, in);
    mutate_sign_signed30(&m.modulus);
    for (vartime = 0; vartime < 2; ++vartime) {
        /* compute inverse */
        (vartime ? secp256k1_modinv32_var : secp256k1_modinv32)(&x, &m);

        /* produce output */
        signed30_to_uint16(out, &x);

        /* check if the inverse times the input is 1 (mod m), unless x is 0. */
        mulmod256(tmp, out, in, mod);
        CHECK(tmp[0] == nonzero);
        for (i = 1; i < 16; ++i) CHECK(tmp[i] == 0);

        /* invert again */
        (vartime ? secp256k1_modinv32_var : secp256k1_modinv32)(&x, &m);

        /* check if the result is equal to the input */
        signed30_to_uint16(tmp, &x);
        for (i = 0; i < 16; ++i) CHECK(tmp[i] == in[i]);
    }
}